

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::set_val_ref(Tree *this,size_t node,csubstr ref)

{
  csubstr ref_00;
  Location loc;
  error_flags eVar1;
  NodeData *pNVar2;
  char *in_RCX;
  NodeScalar *in_RDX;
  size_t in_RSI;
  undefined8 in_RDI;
  bool bVar3;
  NodeData *n;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Location *in_stack_ffffffffffffff50;
  Tree *in_stack_ffffffffffffff58;
  undefined1 has_scalar;
  size_t in_stack_ffffffffffffff88;
  Tree *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Location *in_stack_ffffffffffffffb0;
  Tree *in_stack_ffffffffffffffb8;
  
  has_scalar = (undefined1)((ulong)in_RDI >> 0x38);
  pNVar2 = _p(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar3 = false;
  if (((pNVar2->m_type).type & VALANCH) != NOTYPE) {
    bVar3 = ((pNVar2->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
  }
  if (bVar3) {
    eVar1 = get_error_flags();
    in_stack_ffffffffffffff58 = in_stack_ffffffffffffffb8;
    if (((eVar1 & 1) != 0) &&
       (bVar3 = is_debugger_attached(), in_stack_ffffffffffffff58 = in_stack_ffffffffffffffb8, bVar3
       )) {
      trap_instruction();
      in_stack_ffffffffffffff58 = in_stack_ffffffffffffffb8;
    }
    Location::Location(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40
                       ,in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff50 = in_stack_ffffffffffffffb0;
    in_stack_ffffffffffffff48 = in_stack_ffffffffffffffa8;
    loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff48;
    loc.super_LineCol.offset = in_stack_ffffffffffffffa0;
    loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff50;
    loc.name.str = (char *)in_stack_ffffffffffffff58;
    loc.name.len = in_RSI;
    error<37ul>((char (*) [37])in_stack_ffffffffffffff90,loc);
  }
  pNVar2 = _p(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ref_00.len = (size_t)pNVar2;
  ref_00.str = in_RCX;
  NodeScalar::set_ref_maybe_replacing_scalar(in_RDX,ref_00,(bool)has_scalar);
  _add_flags(in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50,
             (type_bits)in_stack_ffffffffffffff48);
  return;
}

Assistant:

void set_val_ref   (size_t node, csubstr ref   ) { RYML_ASSERT( ! has_val_anchor(node)); NodeData* C4_RESTRICT n = _p(node); n->m_val.set_ref_maybe_replacing_scalar(ref, n->m_type.has_val()); _add_flags(node, VAL|VALREF); }